

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::detail::filldata<const_char16_t[19]>::fill(ostream *stream,char16_t (*in) [19])

{
  long lVar1;
  String local_40;
  
  std::operator<<(stream,"[");
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 0x13) {
        std::operator<<(stream,"]");
        return;
      }
      std::operator<<(stream,", ");
    }
    String::String(&local_40,"{?}");
    operator<<(stream,&local_40);
    String::~String(&local_40);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }